

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QString * __thiscall
QDateTimePrivate::localNameAtMillis
          (QString *__return_storage_ptr__,QDateTimePrivate *this,qint64 millis,DaylightStatus dst)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  QFlagsStorage<QDateTimePrivate::TransitionOption> resolve;
  longlong __old_val;
  undefined1 *puVar5;
  long in_FS_OFFSET;
  R_conflict17 RVar6;
  QTimeZone sys;
  Data local_70;
  QArrayDataPointer<char16_t> local_68;
  undefined1 local_48 [16];
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  resolve.i = (Int)toTransitionOptions((DaylightStatus)millis);
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  bVar4 = millisInSystemRange((qint64)this,86400000);
  if (bVar4) {
    QLocalTime::localTimeAbbbreviationAt
              ((QString *)local_48,(QLocalTime *)this,(ulong)resolve.i,(TransitionOptions)dst);
    puVar5 = local_38;
    qVar3 = local_68.size;
    pcVar2 = local_68.ptr;
    pDVar1 = local_68.d;
    local_68.d = (Data *)local_48._0_8_;
    local_68.ptr = (char16_t *)local_48._8_8_;
    local_48._0_8_ = pDVar1;
    local_48._8_8_ = pcVar2;
    local_68.size = (qsizetype)local_38;
    local_38 = (undefined1 *)qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_48);
    qVar3 = local_68.size;
    pcVar2 = local_68.ptr;
    pDVar1 = local_68.d;
    dst = (DaylightStatus)puVar5;
    if ((undefined1 *)local_68.size != (undefined1 *)0x0) {
      local_68.d = (Data *)0x0;
      local_68.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).d = pDVar1;
      (__return_storage_ptr__->d).ptr = pcVar2;
      local_68.size = 0;
      (__return_storage_ptr__->d).size = qVar3;
      goto LAB_0030e099;
    }
  }
  local_70.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QTimeZone::systemTimeZone();
  bVar4 = QTimeZone::isValid((QTimeZone *)&local_70.s);
  if (bVar4) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    dst = resolve.i;
    QTimeZonePrivate::stateAtZoneTime
              ((ZoneState *)local_48,local_70.d,(qint64)this,(TransitionOptions)resolve.i);
    if (local_38._0_1_ != true) goto LAB_0030e075;
    (*(local_70.d)->_vptr_QTimeZonePrivate[7])
              (__return_storage_ptr__,local_70.d,
               (undefined1 *)((long)(int)local_48._8_4_ * -1000 + local_48._0_8_));
  }
  else {
LAB_0030e075:
    RVar6 = millisToWithinRange((qint64)this);
    if (((undefined1  [16])RVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      QLocalTime::localTimeAbbbreviationAt
                (__return_storage_ptr__,(QLocalTime *)RVar6.shifted,(ulong)resolve.i,
                 (TransitionOptions)dst);
    }
  }
  QTimeZone::~QTimeZone((QTimeZone *)&local_70.s);
LAB_0030e099:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QDateTimePrivate::localNameAtMillis(qint64 millis, DaylightStatus dst)
{
    const QDateTimePrivate::TransitionOptions resolve = toTransitionOptions(dst);
    QString abbreviation;
    if (millisInSystemRange(millis, MSECS_PER_DAY)) {
        abbreviation = QLocalTime::localTimeAbbbreviationAt(millis, resolve);
        if (!abbreviation.isEmpty())
            return abbreviation;
    }

    // Otherwise, outside the system range.
#if QT_CONFIG(timezone)
    // Use the system zone:
    const auto sys = QTimeZone::systemTimeZone();
    if (sys.isValid()) {
        ZoneState state = zoneStateAtMillis(sys, millis, resolve);
        if (state.valid)
            return sys.d->abbreviation(state.when - state.offset * MSECS_PER_SEC);
    }
#endif // timezone

    // Kludge
    // Use a time in the system range with the same day-of-week pattern to its year:
    auto fake = millisToWithinRange(millis);
    if (Q_LIKELY(fake.good))
        return QLocalTime::localTimeAbbbreviationAt(fake.shifted, resolve);

    // Overflow, apparently.
    return {};
}